

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_geom_face(REF_GRID ref_grid,REF_INT node)

{
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_INTERP pRVar2;
  REF_ADJ pRVar3;
  REF_DBL *pRVar4;
  REF_ADAPT pRVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  undefined8 uVar12;
  REF_STATUS RVar13;
  char *pcVar14;
  bool bVar15;
  REF_INT id;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL qtet;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_DBL normdev;
  REF_DBL qtri;
  REF_DBL uv [2];
  REF_DBL normdev_orig;
  REF_DBL min_uv_area;
  REF_DBL qtri_orig;
  REF_DBL qtet_orig;
  REF_DBL uv_max [2];
  REF_DBL uv_min [2];
  REF_DBL uv_ideal [2];
  REF_DBL uv_orig [2];
  int local_148;
  REF_INT local_140;
  int local_13c;
  double local_138;
  double local_130;
  double local_128;
  REF_DBL local_120;
  int local_114;
  int local_110;
  int local_10c;
  double local_108;
  REF_NODE local_100;
  double local_f8;
  REF_DBL local_f0;
  double local_e8 [3];
  long local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  REF_DBL local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  REF_DBL local_88 [4];
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  local_f0 = 0.0;
  local_120 = 0.0;
  pRVar2 = ref_grid->interp;
  if ((node < 0) ||
     (((((pRVar3 = ref_grid->cell[6]->ref_adj, pRVar3->nnode <= node ||
         (pRVar3->first[(uint)node] == -1)) &&
        ((pRVar3 = ref_grid->cell[10]->ref_adj, pRVar3->nnode <= node ||
         (pRVar3->first[(uint)node] == -1)))) &&
       ((pRVar3 = ref_grid->cell[9]->ref_adj, pRVar3->nnode <= node ||
        (pRVar3->first[(uint)node] == -1)))) &&
      ((pRVar3 = ref_grid->cell[0xb]->ref_adj, pRVar3->nnode <= node ||
       (pRVar3->first[(uint)node] == -1)))))) {
    uVar7 = ref_geom_is_a(ref_geom,node,0,&local_10c);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x6b3,"ref_smooth_geom_face",(ulong)uVar7,"node check");
      return uVar7;
    }
    local_100 = pRVar1;
    uVar7 = ref_geom_is_a(ref_geom,node,1,&local_110);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x6b4,"ref_smooth_geom_face",(ulong)uVar7,"edge check");
      return uVar7;
    }
    uVar7 = ref_geom_is_a(ref_geom,node,2,&local_114);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x6b5,"ref_smooth_geom_face",(ulong)uVar7,"face check");
      return uVar7;
    }
    bVar15 = true;
    if ((-1 < node) && (pRVar3 = ref_grid->cell[6]->ref_adj, node < pRVar3->nnode)) {
      bVar15 = pRVar3->first[(uint)node] == -1;
    }
    if (local_10c == 0) {
      if (local_110 == 0) {
        if (local_114 == 0) {
          pcVar14 = "geom face required";
          uVar12 = 0x6b9;
        }
        else {
          if (bVar15) {
            uVar7 = ref_geom_unique_id(ref_geom,node,2,&local_140);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x6bd,"ref_smooth_geom_face",(ulong)uVar7,"get-id");
              ref_clump_around(ref_grid,node,"get-id.tec");
              return uVar7;
            }
            uVar7 = ref_geom_tuv(ref_geom,node,2,local_140,local_88 + 2);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x6be,"ref_smooth_geom_face",(ulong)uVar7,"get uv_orig");
              return uVar7;
            }
            if (ref_grid->surf == 0) {
              uVar7 = ref_smooth_tet_quality_around(ref_grid,node,&local_b0);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x6c5,"ref_smooth_geom_face",(ulong)uVar7,"q tet");
                pRVar4 = local_100->real;
                lVar10 = (long)(node * 0xf);
                printf(" %f %f %f\n",pRVar4[lVar10],pRVar4[lVar10 + 1],pRVar4[lVar10 + 2]);
                return uVar7;
              }
            }
            else {
              local_b0 = 1.0;
            }
            uVar7 = ref_smooth_tri_quality_around(ref_grid,node,&local_b8);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x6c7,"ref_smooth_geom_face",(ulong)uVar7,"q tri");
              return uVar7;
            }
            uVar7 = ref_smooth_tri_normdev_around(ref_grid,node,&local_c8);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x6c8,"ref_smooth_geom_face",(ulong)uVar7,"nd_orig");
              return uVar7;
            }
            uVar7 = ref_smooth_tri_ratio_around(ref_grid,node,&local_130,&local_138);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x6ca,"ref_smooth_geom_face",(ulong)uVar7,"ratio");
              return uVar7;
            }
            bVar15 = false;
            local_108 = local_b8;
            if ((0.5 < local_b8) && (0.5 < local_130)) {
              bVar15 = local_138 < 2.0;
            }
            local_148 = -1;
            if ((pRVar2 != (REF_INTERP)0x0) && (pRVar2->continuously != 0)) {
              local_148 = pRVar2->cell[node];
            }
            uVar7 = 0;
            if (bVar15) {
              uVar8 = ref_smooth_tri_pliant_uv(ref_grid,node,local_88);
              if (uVar8 != 0) {
                uVar12 = 0x6d8;
                uVar7 = uVar8;
LAB_0020e702:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,uVar12,"ref_smooth_geom_face",(ulong)uVar7,"ideal");
                uVar8 = uVar7;
              }
            }
            else {
              uVar8 = ref_smooth_tri_weighted_ideal_uv(ref_grid,node,local_88);
              if (uVar8 != 0) {
                uVar12 = 0x6da;
                uVar7 = uVar8;
                goto LAB_0020e702;
              }
            }
            if (uVar8 != 0) {
              return uVar7;
            }
            uVar8 = ref_geom_tri_uv_bounding_box(ref_grid,node,&local_98,&local_a8);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x6dd,"ref_smooth_geom_face",(ulong)uVar8,"bb");
              return uVar8;
            }
            local_68 = local_c8;
            uStack_60 = 0;
            local_48 = local_c8 * 0.9;
            uStack_40 = 0;
            local_58 = local_108 * 0.9;
            uStack_50 = 0;
            local_d0 = (long)node;
            local_128 = 1.0;
            local_13c = 0;
            do {
              lVar10 = 0;
              do {
                local_e8[lVar10] =
                     local_88[lVar10] * local_128 + local_88[lVar10 + 2] * (1.0 - local_128);
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              uVar8 = ref_geom_add(ref_geom,node,2,local_140,local_e8);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x6e4,"ref_smooth_geom_face",(ulong)uVar8,"set uv");
                return uVar8;
              }
              uVar8 = ref_geom_constrain(ref_grid,node);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x6e5,"ref_smooth_geom_face",(ulong)uVar8,"constrain");
                return uVar8;
              }
              uVar8 = ref_metric_interpolate_node(ref_grid,node);
              if ((uVar8 != 0) && (uVar8 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x6e7,"ref_smooth_geom_face",(ulong)uVar8,
                       "ref_metric_interpolate_node failed");
                uVar7 = uVar8;
              }
              if ((uVar8 != 5) && (uVar8 != 0)) {
                return uVar7;
              }
              if (ref_grid->surf == 0) {
                uVar9 = ref_smooth_tet_quality_around(ref_grid,node,&local_120);
                if (uVar9 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x6ee,"ref_smooth_geom_face",(ulong)uVar9,"q tet");
                  return uVar9;
                }
                uVar9 = ref_smooth_tet_ratio_around(ref_grid,node,&local_130,&local_138);
                if (uVar9 != 0) {
                  uVar12 = 0x6f0;
                  uVar7 = uVar9;
                  goto LAB_0020e9c8;
                }
              }
              else {
                local_120 = 1.0;
                uVar9 = ref_smooth_tri_ratio_around(ref_grid,node,&local_130,&local_138);
                if (uVar9 != 0) {
                  uVar12 = 0x6ec;
                  uVar7 = uVar9;
LAB_0020e9c8:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,uVar12,"ref_smooth_geom_face",(ulong)uVar7,"ratio");
                  uVar9 = uVar7;
                }
              }
              if (uVar9 != 0) {
                return uVar7;
              }
              uVar9 = ref_smooth_tri_quality_around(ref_grid,node,&local_f0);
              if (uVar9 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x6f2,"ref_smooth_geom_face",(ulong)uVar9,"q tri");
                return uVar9;
              }
              uVar9 = ref_smooth_tri_normdev_around(ref_grid,node,&local_f8);
              if (uVar9 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x6f3,"ref_smooth_geom_face",(ulong)uVar9,"nd");
                return uVar9;
              }
              uVar9 = ref_smooth_tri_uv_area_around(ref_grid,node,&local_c0);
              if (uVar9 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x6f4,"ref_smooth_geom_face",(ulong)uVar9,"a");
                return uVar9;
              }
              if (uVar8 == 0) {
                bVar11 = ref_grid->adapt->post_min_normdev < local_f8 || local_68 < local_f8;
              }
              else {
                bVar11 = false;
              }
              bVar6 = false;
              if ((bVar11) && (bVar6 = false, local_48 < local_f8)) {
                if (local_c0 < local_100->min_uv_area || local_c0 == local_100->min_uv_area) {
LAB_0020ebaf:
                  bVar6 = false;
                }
                else {
                  bVar6 = false;
                  if ((((local_98 < local_e8[0]) && (local_e8[0] < local_a8)) &&
                      (bVar6 = false, local_90 < local_e8[1])) && (local_e8[1] < local_a0)) {
                    pRVar5 = ref_grid->adapt;
                    if ((local_120 < pRVar5->smooth_min_quality ||
                         local_120 == pRVar5->smooth_min_quality) ||
                       (local_130 < pRVar5->post_min_ratio)) goto LAB_0020ebaf;
                    bVar6 = local_138 <= pRVar5->post_max_ratio;
                  }
                }
              }
              if (bVar15) {
                bVar11 = 0.4 < local_f0 && local_58 < local_f0;
              }
              else {
                bVar11 = local_108 < local_f0;
              }
              if ((bool)(bVar6 & bVar11)) goto LAB_0020e1db;
              local_128 = local_128 * 0.5;
              if (uVar8 != 0 && local_148 != -1) {
                pRVar2->cell[local_d0] = local_148;
              }
              local_13c = local_13c + 1;
            } while (local_13c != 8);
            uVar8 = ref_geom_add(ref_geom,node,2,local_140,local_88 + 2);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x710,"ref_smooth_geom_face",(ulong)uVar8,"set t");
              return uVar8;
            }
            uVar8 = ref_geom_constrain(ref_grid,node);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x711,"ref_smooth_geom_face",(ulong)uVar8,"constrain");
              return uVar8;
            }
            uVar8 = ref_metric_interpolate_node(ref_grid,node);
            if ((uVar8 != 0) && (uVar8 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x712,"ref_smooth_geom_face",(ulong)uVar8,"interp");
              uVar7 = uVar8;
            }
            if ((uVar8 != 5) && (uVar8 != 0)) {
              return uVar7;
            }
            goto LAB_0020e1db;
          }
          pcVar14 = "quads not allowed";
          uVar12 = 0x6ba;
        }
      }
      else {
        pcVar14 = "geom edge not allowed";
        uVar12 = 0x6b8;
      }
    }
    else {
      pcVar14 = "geom node not allowed";
      uVar12 = 0x6b7;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar12
           ,"ref_smooth_geom_face",pcVar14);
    RVar13 = 1;
  }
  else {
LAB_0020e1db:
    RVar13 = 0;
  }
  return RVar13;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_geom_face(REF_GRID ref_grid, REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_BOOL geom_node, geom_edge, geom_face, no_quads;
  REF_INT id;
  REF_DBL uv_orig[2], uv_ideal[2];
  REF_DBL qtet_orig, qtri_orig;
  REF_DBL qtri = 0.0, qtet = 0.0, min_uv_area, min_ratio, max_ratio;
  REF_DBL normdev_orig, normdev;
  REF_DBL backoff, uv[2];
  REF_INT tries, iuv;
  REF_DBL uv_min[2], uv_max[2];
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing = REF_FALSE;
  REF_BOOL accept;

  REF_BOOL verbose = REF_FALSE;

  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pri(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node)) return REF_SUCCESS;
  if (!ref_cell_node_empty(ref_grid_hex(ref_grid), node)) return REF_SUCCESS;

  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
  RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face check");
  no_quads = ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  RAS(!geom_node, "geom node not allowed");
  RAS(!geom_edge, "geom edge not allowed");
  RAS(geom_face, "geom face required");
  RAS(no_quads, "quads not allowed");

  RSB(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "get-id",
      ref_clump_around(ref_grid, node, "get-id.tec"));
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "get uv_orig");
  if (ref_grid_surf(ref_grid)) {
    qtet_orig = 1.0;
  } else {
    RSB(ref_smooth_tet_quality_around(ref_grid, node, &qtet_orig), "q tet", {
      printf(" %f %f %f\n", ref_node_xyz(ref_node, 0, node),
             ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));
    });
  }
  RSS(ref_smooth_tri_quality_around(ref_grid, node, &qtri_orig), "q tri");
  RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev_orig), "nd_orig");
  RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (qtri_orig > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  if (verbose)
    printf("uv %f %f tri %f tet %f\n", uv_orig[0], uv_orig[1], qtri_orig,
           qtet_orig);

  if (pliant_smoothing) {
    RSS(ref_smooth_tri_pliant_uv(ref_grid, node, uv_ideal), "ideal");
  } else {
    RSS(ref_smooth_tri_weighted_ideal_uv(ref_grid, node, uv_ideal), "ideal");
  }

  RSS(ref_geom_tri_uv_bounding_box(ref_grid, node, uv_min, uv_max), "bb");

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (iuv = 0; iuv < 2; iuv++)
      uv[iuv] = backoff * uv_ideal[iuv] + (1.0 - backoff) * uv_orig[iuv];

    RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv), "set uv");
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");

    if (ref_grid_surf(ref_grid)) {
      qtet = 1.0;
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    } else {
      RSS(ref_smooth_tet_quality_around(ref_grid, node, &qtet), "q tet");
      RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");
    }
    RSS(ref_smooth_tri_quality_around(ref_grid, node, &qtri), "q tri");
    RSS(ref_smooth_tri_normdev_around(ref_grid, node, &normdev), "nd");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area), "a");

    accept = (REF_SUCCESS == interp_status);
    accept = accept && (normdev > ref_grid_adapt(ref_grid, post_min_normdev) ||
                        normdev > normdev_orig);
    accept = accept && (normdev > 0.9 * normdev_orig);
    accept = accept && (min_uv_area > ref_node_min_uv_area(ref_node));
    accept = accept && (uv_min[0] < uv[0]) && (uv[0] < uv_max[0]);
    accept = accept && (uv_min[1] < uv[1]) && (uv[1] < uv_max[1]);
    accept = accept && (qtet > ref_grid_adapt(ref_grid, smooth_min_quality));
    accept = accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
    accept = accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));
    if (pliant_smoothing) {
      accept = accept && (qtri > 0.9 * qtri_orig);
      accept = accept && (qtri > 0.4);
    } else {
      accept = accept && (qtri > qtri_orig);
    }

    if (accept) {
      if (verbose) printf("better qtri %f qtet %f\n", qtri, qtet);
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "set t");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  if (verbose)
    printf("undo qtri %f qtet %f was %f %f\n", qtri, qtet, qtri_orig,
           qtet_orig);

  return REF_SUCCESS;
}